

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleCreateInstance
              (int tipCount,int partialsBufferCount,int compactBufferCount,int stateCount,
              int patternCount,int eigenBufferCount,int matrixBufferCount,int categoryCount,
              int scaleBufferCount,int *resourceList,int resourceCount,long preferenceFlags,
              long requirementFlags,BeagleInstanceDetails *returnInfo)

{
  BeagleImplFactory *pBVar1;
  bool bVar2;
  vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *pvVar3;
  void *pvVar4;
  reference ppVar5;
  size_type sVar6;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  int *in_stack_00000040;
  bad_alloc *anon_var_0;
  out_of_range *anon_var_0_1;
  int returnValue;
  int instance;
  BeagleImplFactory *factory;
  int resource;
  iterator it;
  BeagleImpl *bestBeagle;
  RsrcImplList *possibleResourceImplementations;
  PairedList *possibleResources;
  int errorCode;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  key_type *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int local_a0;
  _Self local_88;
  _Self local_80;
  long *local_78;
  void *local_70;
  void *local_68;
  key_type local_60 [5];
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  int local_34;
  
  local_4c = in_R9D;
  local_48 = in_R8D;
  local_44 = in_ECX;
  local_40 = in_EDX;
  local_3c = in_ESI;
  local_38 = in_EDI;
  if (instances == (vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *)0x0) {
    pvVar3 = (vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *)
             operator_new(0x18);
    std::vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>::vector
              ((vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *)0x120edb);
    instances = pvVar3;
  }
  if (rsrcList == (BeagleResourceList *)0x0) {
    beagleGetResourceList();
  }
  if (implFactory_abi_cxx11_ ==
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    beagleGetFactoryList_abi_cxx11_();
  }
  loaded = 1;
  local_60[0] = 0;
  pvVar4 = operator_new(0x18);
  std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
            ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x121008);
  local_68 = pvVar4;
  local_60[0] = filterResources((int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                                ,in_stack_fffffffffffffef4,
                                CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                (PairedList *)
                                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  pvVar4 = local_68;
  if (local_60[0] == 0) {
    pvVar4 = operator_new(0x18);
    std::__cxx11::
    list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
    ::list((list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
            *)0x1210c9);
    local_70 = pvVar4;
    local_60[0] = rankResourceImplementationPairs
                            (CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                             (PairedList *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                             (RsrcImplList *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    pvVar4 = local_68;
    if (local_68 != (void *)0x0) {
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x121138);
      operator_delete(pvVar4);
    }
    pvVar4 = local_70;
    if (local_60[0] == 0) {
      local_78 = (long *)0x0;
      local_60[0] = -6;
      local_80._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
           ::begin((list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      while( true ) {
        local_88._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
             ::end((list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        bVar2 = std::operator!=(&local_80,&local_88);
        if (!bVar2) break;
        std::_List_iterator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>::
        operator*((_List_iterator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_> *)
                  0x121203);
        ppVar5 = std::_List_iterator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>
                 ::operator*((_List_iterator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>
                              *)0x121217);
        pBVar1 = (ppVar5->second).second;
        uVar7 = local_38;
        uVar8 = local_3c;
        uVar9 = local_40;
        uVar10 = local_44;
        uVar11 = local_48;
        in_stack_fffffffffffffe58 = local_4c;
        in_stack_fffffffffffffe68 = in_stack_00000010;
        in_stack_fffffffffffffe70 = in_stack_00000018;
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe98);
        in_stack_fffffffffffffe98 = local_60;
        local_78 = (long *)(*(code *)**(undefined8 **)pBVar1)
                                     (pBVar1,uVar7,uVar8,uVar9,uVar10,uVar11);
        if (local_78 != (long *)0x0) break;
        std::_List_iterator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>::
        operator++(&local_80);
      }
      pvVar4 = local_70;
      if (local_70 != (void *)0x0) {
        std::__cxx11::
        list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
        ::~list((list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
                 *)0x1213d2);
        operator_delete(pvVar4);
      }
      if (local_78 == (long *)0x0) {
        local_34 = local_60[0];
      }
      else {
        sVar6 = std::vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>::size
                          (instances);
        std::vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_>::push_back
                  ((vector<beagle::BeagleImpl_*,_std::allocator<beagle::BeagleImpl_*>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (value_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        local_a0 = (**(code **)(*local_78 + 0x18))(local_78,in_stack_00000040);
        if (local_a0 == 0) {
          *(char **)(in_stack_00000040 + 2) = rsrcList->list[*in_stack_00000040].name;
          *(char **)(in_stack_00000040 + 6) = "none";
          local_a0 = (int)sVar6;
        }
        local_34 = local_a0;
      }
    }
    else {
      if (local_70 != (void *)0x0) {
        std::__cxx11::
        list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
        ::~list((list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
                 *)0x121172);
        operator_delete(pvVar4);
      }
      local_34 = local_60[0];
    }
  }
  else {
    if (local_68 != (void *)0x0) {
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x121088);
      operator_delete(pvVar4);
    }
    local_34 = local_60[0];
  }
  return local_34;
}

Assistant:

int beagleCreateInstance(int tipCount,
                         int partialsBufferCount,
                         int compactBufferCount,
                         int stateCount,
                         int patternCount,
                         int eigenBufferCount,
                         int matrixBufferCount,
                         int categoryCount,
                         int scaleBufferCount,
                         int* resourceList,
                         int resourceCount,
                         long preferenceFlags,
                         long requirementFlags,
                         BeagleInstanceDetails* returnInfo) {
    DEBUG_CREATE_TIME();
    try {
        if (instances == NULL)
            instances = new std::vector<beagle::BeagleImpl*>;

        if (rsrcList == NULL)
            beagleGetResourceList();

        if (implFactory == NULL)
            beagleGetFactoryList();

        loaded = 1;

        int errorCode = BEAGLE_SUCCESS;

        PairedList* possibleResources = new PairedList;

        errorCode = filterResources(resourceList,
                                    resourceCount,
                                    preferenceFlags,
                                    requirementFlags,
                                    possibleResources);

        if (errorCode != BEAGLE_SUCCESS) {
            delete possibleResources;
            return errorCode;
        }

        RsrcImplList* possibleResourceImplementations = new RsrcImplList;

        errorCode = rankResourceImplementationPairs(preferenceFlags,
                                                    requirementFlags,
                                                    possibleResources,
                                                    possibleResourceImplementations);

        delete possibleResources;

        if (errorCode != BEAGLE_SUCCESS) {
            delete possibleResourceImplementations;
            return errorCode;
        }

        beagle::BeagleImpl* bestBeagle = NULL;
        errorCode = BEAGLE_ERROR_NO_RESOURCE;

        for(RsrcImplList::iterator it = possibleResourceImplementations->begin(); it != possibleResourceImplementations->end(); ++it) {
            int resource = (*it).second.first;
            beagle::BeagleImplFactory* factory = (*it).second.second;

            bestBeagle = factory->createImpl(tipCount, partialsBufferCount,
                                                                compactBufferCount, stateCount,
                                                                patternCount, eigenBufferCount,
                                                                matrixBufferCount, categoryCount,
                                                                scaleBufferCount,
                                                                resource,
                                                                ResourceMap[resource],
                                                                preferenceFlags,
                                                                requirementFlags,
                                                                &errorCode);

            if (bestBeagle != NULL)
                break;
        }

        delete possibleResourceImplementations;

        if (bestBeagle != NULL) {

            int instance = instances->size();
            instances->push_back(bestBeagle);

            int returnValue = bestBeagle->getInstanceDetails(returnInfo);
            if (returnValue == BEAGLE_SUCCESS) {
                returnInfo->resourceName = rsrcList->list[returnInfo->resourceNumber].name;
                // TODO: move implDescription to inside the implementation
                returnInfo->implDescription = (char*) "none";

                returnValue = instance;
            }
            return returnValue;
        }

        // No implementations found or appropriate, return last error code
        return errorCode;
    }
    catch (std::bad_alloc &) {
        return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    catch (std::out_of_range &) {
        return BEAGLE_ERROR_OUT_OF_RANGE;
    }
    catch (...) {
        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
    }
    loaded = 1;

}